

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_alphargbblit_generic
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uint *src,int mapWidth,
               int mapHeight,int srcStride,QClipData *clip,bool useGammaCorrection)

{
  DestFetchProc64 p_Var1;
  DestStoreProc64 p_Var2;
  ClipLine *pCVar3;
  QT_FT_Span *pQVar4;
  QColorTrcLut *this;
  QRgba64 *pQVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QRgba64 buffer [2048];
  uint *local_4090;
  QRgba64 local_4040;
  QRgba64 local_4038 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (color->rgba >> 0x30 == 0) goto LAB_005a8c4f;
  local_4040.rgba = color->rgba;
  if (useGammaCorrection) {
    this = QGuiApplicationPrivate::colorProfileForA32Text(QGuiApplicationPrivate::self);
    local_4040 = (QRgba64)color->rgba;
    if (this == (QColorTrcLut *)0x0) goto LAB_005a8cce;
    if ((short)(local_4040.rgba >> 0x30) == -1) {
      local_4040 = QColorTrcLut::toLinear(this,local_4040);
    }
  }
  else {
LAB_005a8cce:
    this = (QColorTrcLut *)0x0;
  }
  p_Var1 = destFetchProc64[rasterBuffer->format];
  p_Var2 = destStoreProc64[rasterBuffer->format];
  if (clip == (QClipData *)0x0) {
    iVar7 = 0;
    local_4090 = src;
    if (mapHeight < 1) {
      mapHeight = iVar7;
    }
    for (; iVar7 != mapHeight; iVar7 = iVar7 + 1) {
      iVar13 = x;
      for (uVar8 = mapWidth; 0 < (int)uVar8; uVar8 = uVar8 - iVar9) {
        uVar6 = 0x800;
        if (uVar8 < 0x800) {
          uVar6 = (ulong)uVar8;
        }
        iVar9 = (int)uVar6;
        pQVar5 = (*p_Var1)(local_4038,rasterBuffer,iVar13,y + iVar7,iVar9);
        for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
          alphargbblend_generic
                    (local_4090[(long)(iVar13 - x) + uVar15],pQVar5,(int)uVar15,&local_4040,color,
                     this);
        }
        if (p_Var2 != (DestStoreProc64)0x0) {
          (*p_Var2)(rasterBuffer,iVar13,y + iVar7,pQVar5,iVar9);
        }
        iVar13 = iVar13 + iVar9;
      }
      local_4090 = local_4090 + srcStride;
    }
  }
  else {
    iVar7 = mapHeight + y;
    if (rasterBuffer->m_height <= mapHeight + y) {
      iVar7 = rasterBuffer->m_height;
    }
    uVar6 = 0;
    if (0 < y) {
      uVar6 = (ulong)(uint)y;
    }
    QClipData::initialize(clip);
    local_4090 = src + ((long)(((int)uVar6 - y) * srcStride) - (long)x);
    for (; (long)uVar6 < (long)iVar7; uVar6 = uVar6 + 1) {
      pCVar3 = clip->m_clipLines;
      for (lVar12 = 0; lVar12 < pCVar3[uVar6].count; lVar12 = lVar12 + 1) {
        pQVar4 = pCVar3[uVar6].spans;
        iVar13 = pQVar4[lVar12].x;
        iVar9 = x;
        if (x < iVar13) {
          iVar9 = iVar13;
        }
        iVar10 = pQVar4[lVar12].len + iVar13;
        if (mapWidth + x < iVar10) {
          iVar10 = mapWidth + x;
        }
        iVar11 = iVar10 - iVar9;
        if (iVar11 != 0 && iVar9 <= iVar10) {
          pQVar5 = (*p_Var1)(local_4038,rasterBuffer,iVar9,pQVar4[lVar12].y,iVar11);
          if (iVar13 <= x) {
            iVar13 = x;
          }
          for (lVar14 = (long)iVar13; lVar14 < iVar10; lVar14 = lVar14 + 1) {
            alphargbblend_generic
                      (local_4090[lVar14],pQVar5,(int)lVar14 - iVar13,&local_4040,color,this);
          }
          if (p_Var2 != (DestStoreProc64)0x0) {
            (*p_Var2)(rasterBuffer,iVar9,pQVar4[lVar12].y,pQVar5,iVar11);
          }
        }
      }
      local_4090 = local_4090 + srcStride;
    }
  }
LAB_005a8c4f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_alphargbblit_generic(QRasterBuffer *rasterBuffer,
                                    int x, int y, const QRgba64 &color,
                                    const uint *src, int mapWidth, int mapHeight, int srcStride,
                                    const QClipData *clip, bool useGammaCorrection)
{
    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA32Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    if (!clip) {
        for (int ly = 0; ly < mapHeight; ++ly) {
            int i = x;
            int length = mapWidth;
            while (length > 0) {
                int l = qMin(BufferSize, length);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                for (int j=0; j < l; ++j) {
                    const uint coverage = src[j + (i - x)];
                    alphargbblend_generic(coverage, dest, j, srcColor, color, colorProfile);
                }
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest, l);
                length -= l;
                i += l;
            }
            src += srcStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        src += (top - y) * srcStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                if (end <= start)
                    continue;
                Q_ASSERT(end - start <= BufferSize);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, start, clip.y, end - start);

                for (int xp=start; xp<end; ++xp) {
                    const uint coverage = src[xp - x];
                    alphargbblend_generic(coverage, dest, xp - start, srcColor, color, colorProfile);
                }
                if (destStore64)
                    destStore64(rasterBuffer, start, clip.y, dest, end - start);
            } // for (i -> line.count)
            src += srcStride;
        } // for (yp -> bottom)
    }
}